

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_handle_lifetime.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZESHandleLifetimeValidation::zesDriverEventListenExPrologue
          (ZESHandleLifetimeValidation *this,ze_driver_handle_t hDriver,uint64_t timeout,
          uint32_t count,zes_device_handle_t *phDevices,uint32_t *pNumDeviceEvents,
          zes_event_type_flags_t *pEvents)

{
  long lVar1;
  bool bVar2;
  ze_result_t zVar3;
  ulong uVar4;
  
  lVar1 = context;
  bVar2 = HandleLifetimeValidation::isHandleValid
                    (*(HandleLifetimeValidation **)(context + 0xd48),hDriver);
  zVar3 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (bVar2) {
    if (count != 0 && phDevices != (zes_device_handle_t *)0x0) {
      uVar4 = 1;
      do {
        bVar2 = HandleLifetimeValidation::isHandleValid
                          (*(HandleLifetimeValidation **)(lVar1 + 0xd48),phDevices[uVar4 - 1]);
        if (!bVar2) {
          return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
      } while ((phDevices != (zes_device_handle_t *)0x0) &&
              (bVar2 = uVar4 < count, uVar4 = uVar4 + 1, bVar2));
    }
    zVar3 = ZE_RESULT_SUCCESS;
  }
  return zVar3;
}

Assistant:

ze_result_t
    ZESHandleLifetimeValidation::zesDriverEventListenExPrologue(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver instance
        uint64_t timeout,                               ///< [in] if non-zero, then indicates the maximum time (in milliseconds) to
                                                        ///< yield before returning ::ZE_RESULT_SUCCESS or ::ZE_RESULT_NOT_READY;
                                                        ///< if zero, then will check status and return immediately;
                                                        ///< if `UINT64_MAX`, then function will not return until events arrive.
        uint32_t count,                                 ///< [in] Number of device handles in phDevices.
        zes_device_handle_t* phDevices,                 ///< [in][range(0, count)] Device handles to listen to for events. Only
                                                        ///< devices from the provided driver handle can be specified in this list.
        uint32_t* pNumDeviceEvents,                     ///< [in,out] Will contain the actual number of devices in phDevices that
                                                        ///< generated events. If non-zero, check pEvents to determine the devices
                                                        ///< and events that were received.
        zes_event_type_flags_t* pEvents                 ///< [in,out] An array that will continue the list of events for each
                                                        ///< device listened in phDevices.
                                                        ///< This array must be at least as big as count.
                                                        ///< For every device handle in phDevices, this will provide the events
                                                        ///< that occurred for that device at the same position in this array. If
                                                        ///< no event was received for a given device, the corresponding array
                                                        ///< entry will be zero.
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hDriver )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        for (size_t i = 0; ( nullptr != phDevices) && (i < count); ++i){
            if (!context.handleLifetime->isHandleValid( phDevices[i] )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
            }
        }
        return ZE_RESULT_SUCCESS;
    }